

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int isDate(sqlite3_context *context,int argc,sqlite3_value **argv,DateTime *p)

{
  byte bVar1;
  byte bVar2;
  uchar uVar3;
  Mem *pVal;
  double dVar4;
  int iVar5;
  uint uVar6;
  byte *pbVar7;
  long lVar8;
  uchar *zDate;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  byte *z;
  uchar *zDate_00;
  float *pfVar13;
  bool bVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  double local_90;
  int Y;
  undefined4 uStack_84;
  int local_80;
  int M;
  DateTime local_78;
  int *local_48;
  double local_40;
  long local_38;
  
  p->s = 0.0;
  p->validJD = '\0';
  p->rawS = '\0';
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->validTZ = '\0';
  p->tzSet = '\0';
  p->isError = '\0';
  p->field_0x2f = 0;
  p->D = 0;
  p->h = 0;
  p->m = 0;
  p->tz = 0;
  p->iJD = 0;
  p->Y = 0;
  p->M = 0;
  if (argc == 0) {
    iVar5 = sqlite3NotPureFunc(context);
    if (iVar5 != 0) {
      iVar5 = setDateTimeToCurrent(context,p);
      return iVar5;
    }
    return 1;
  }
  pVal = *argv;
  if ("\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x02\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x04\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05"
      [pVal->flags & 0x3f] - 1 < 2) {
    dVar4 = sqlite3VdbeRealValue(pVal);
    uVar15 = SUB84(dVar4,0);
    uVar16 = (undefined4)((ulong)dVar4 >> 0x20);
  }
  else {
    zDate = sqlite3_value_text(pVal);
    if (zDate == (uchar *)0x0) {
      return 1;
    }
    uVar3 = *zDate;
    uVar12 = (ulong)(uVar3 == '-');
    iVar5 = getDigits((char *)(zDate + uVar12),"40f-21a-21d",&Y,&M,&local_80);
    if (iVar5 == 3) {
      zDate_00 = zDate + uVar12 + 9;
      do {
        do {
          pbVar7 = zDate_00 + 1;
          zDate_00 = zDate_00 + 1;
        } while ((ulong)*pbVar7 == 0x54);
      } while ((""[*pbVar7] & 1) != 0);
      iVar5 = parseHhMmSs((char *)zDate_00,p);
      if (iVar5 != 0) {
        if (*zDate_00 != '\0') goto LAB_001bd8b9;
        p->validHMS = '\0';
      }
      p->validJD = '\0';
      p->validYMD = '\x01';
      iVar5 = -Y;
      if (uVar3 != '-') {
        iVar5 = Y;
      }
      p->Y = iVar5;
      p->M = M;
      p->D = local_80;
      if (p->validTZ != '\0') {
        computeJD(p);
      }
      goto LAB_001bd097;
    }
LAB_001bd8b9:
    iVar5 = parseHhMmSs((char *)zDate,p);
    if (iVar5 == 0) goto LAB_001bd097;
    iVar5 = sqlite3StrICmp((char *)zDate,"now");
    if ((iVar5 == 0) && (iVar5 = sqlite3NotPureFunc(context), iVar5 != 0)) {
      iVar5 = setDateTimeToCurrent(context,p);
      if (iVar5 != 0) {
        return 1;
      }
      goto LAB_001bd097;
    }
    iVar5 = sqlite3Strlen30((char *)zDate);
    iVar5 = sqlite3AtoF((char *)zDate,(double *)&local_78,iVar5,'\x01');
    if (iVar5 < 1) {
      return 1;
    }
    uVar15 = (undefined4)local_78.iJD;
    uVar16 = (undefined4)((ulong)local_78.iJD >> 0x20);
  }
  setRawDateNumber(p,(double)CONCAT44(uVar16,uVar15));
LAB_001bd097:
  local_48 = &p->Y;
  local_38 = (long)argc;
  uVar12 = 1;
  do {
    if (local_38 <= (long)uVar12) {
      computeJD(p);
      uVar6 = 1;
      if (p->isError == '\0') {
        uVar6 = (uint)(0x1a6401072fdff < (ulong)p->iJD);
      }
      return uVar6;
    }
    pbVar7 = sqlite3_value_text(argv[uVar12]);
    sqlite3_value_bytes(argv[uVar12]);
    if (pbVar7 == (byte *)0x0) {
      return 1;
    }
    bVar1 = *pbVar7;
    bVar2 = ""[bVar1];
    uVar9 = (ulong)(bVar2 - 0x2b);
    if (bVar2 - 0x2b < 0x40) {
      if ((0x7fe5UL >> (uVar9 & 0x3f) & 1) != 0) {
        lVar10 = 1;
        z = pbVar7;
        while( true ) {
          bVar2 = pbVar7[lVar10];
          if (((bVar2 == 0) || (bVar2 == 0x3a)) || ((""[bVar2] & 1) != 0)) break;
          lVar10 = lVar10 + 1;
          z = z + 1;
        }
        iVar5 = sqlite3AtoF((char *)pbVar7,(double *)&Y,(int)lVar10,'\x01');
        if (iVar5 < 1) {
          return 1;
        }
        if (bVar2 == 0x3a) {
          local_78.s = 0.0;
          local_78.validJD = '\0';
          local_78.rawS = '\0';
          local_78.validYMD = '\0';
          local_78.validHMS = '\0';
          local_78.validTZ = '\0';
          local_78.tzSet = '\0';
          local_78.isError = '\0';
          local_78._47_1_ = 0;
          local_78.D = 0;
          local_78.h = 0;
          local_78.m = 0;
          local_78.tz = 0;
          local_78.iJD = 0;
          local_78.Y = 0;
          local_78.M = 0;
          iVar5 = parseHhMmSs((char *)(pbVar7 + ((ulong)bVar1 - 0x3a < 0xfffffffffffffff6)),
                              &local_78);
          uVar6 = 1;
          if (iVar5 == 0) {
            computeJD(&local_78);
            lVar11 = (local_78.iJD + -43200000) % 86400000;
            lVar10 = -lVar11;
            if (*pbVar7 != 0x2d) {
              lVar10 = lVar11;
            }
            computeJD(p);
            p->validYMD = '\0';
            p->validHMS = '\0';
            p->validTZ = '\0';
            p->iJD = p->iJD + lVar10;
            uVar6 = 0;
          }
        }
        else {
          do {
            pbVar7 = z + 1;
            z = z + 1;
          } while ((""[*pbVar7] & 1) != 0);
          uVar6 = sqlite3Strlen30((char *)z);
          if (uVar6 - 0xb < 0xfffffff8) {
            return 1;
          }
          if ((z[uVar6 - 1] & 0xdf) == 0x53) {
            uVar6 = uVar6 - 1;
          }
          computeJD(p);
          local_90 = (double)CONCAT44(uStack_84,Y);
          local_40 = *(double *)(&DAT_001e0e30 + (ulong)(local_90 < 0.0) * 8);
          pfVar13 = &aXformType[0].rXform;
          for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
            if (((uVar6 == ((anon_struct_16_4_82cfffc4 *)(pfVar13 + -3))->nName) &&
                (iVar5 = sqlite3_strnicmp((char *)((long)pfVar13 + -0xb),(char *)z,uVar6),
                iVar5 == 0)) &&
               (((double)-pfVar13[-1] < local_90 && (local_90 < (double)pfVar13[-1])))) {
              if ((int)lVar10 == 5) {
                computeYMD_HMS(p);
                p->Y = p->Y + (int)local_90;
LAB_001bd7b4:
                p->validJD = '\0';
                local_90 = local_90 - (double)(int)local_90;
              }
              else if ((int)lVar10 == 4) {
                computeYMD_HMS(p);
                iVar5 = p->M + (int)local_90;
                if (iVar5 == 0 || SCARRY4(p->M,(int)local_90) != iVar5 < 0) {
                  uVar6 = -((0xcU - iVar5) / 0xc);
                }
                else {
                  uVar6 = (iVar5 - 1U) / 0xc;
                }
                p->Y = p->Y + uVar6;
                p->M = uVar6 * -0xc + iVar5;
                goto LAB_001bd7b4;
              }
              computeJD(p);
              p->iJD = p->iJD + (long)((double)*pfVar13 * local_90 * 1000.0 + local_40);
              uVar6 = 0;
              goto LAB_001bd2b5;
            }
            pfVar13 = pfVar13 + 4;
          }
          uVar6 = 1;
LAB_001bd2b5:
          p->validYMD = '\0';
          p->validHMS = '\0';
          p->validTZ = '\0';
        }
        goto LAB_001bd2c0;
      }
      if (uVar9 == 0x36) {
        iVar5 = sqlite3StrICmp((char *)pbVar7,"auto");
        if (1 < uVar12) {
          return 1;
        }
        if (iVar5 != 0) {
          return 1;
        }
        if ((p->rawS != '\0') && (p->validJD == '\0')) {
          dVar4 = p->s;
          if (dVar4 < -210866760000.0) {
            return 1;
          }
          if (253402300799.0 < dVar4) {
            return 1;
          }
          dVar4 = dVar4 * 1000.0 + 210866760000000.0;
LAB_001bd754:
          p->validTZ = '\0';
          p->iJD = (long)(dVar4 + 0.5);
          p->validJD = '\x01';
          p->rawS = '\0';
          p->validYMD = '\0';
          p->validHMS = '\0';
          goto LAB_001bd78a;
        }
      }
      else {
        if (uVar9 != 0x3f) goto LAB_001bd328;
        iVar5 = sqlite3StrICmp((char *)pbVar7,"julianday");
        if (1 < uVar12) {
          return 1;
        }
        if (iVar5 != 0) {
          return 1;
        }
        if (p->validJD == '\0') {
          return 1;
        }
        if (p->rawS == '\0') {
          return 1;
        }
      }
      p->rawS = '\0';
    }
    else {
LAB_001bd328:
      if (bVar2 == 0x6c) {
        iVar5 = sqlite3StrICmp((char *)pbVar7,"localtime");
        if (iVar5 != 0) {
          return 1;
        }
        iVar5 = sqlite3NotPureFunc(context);
        if (iVar5 == 0) {
          return 1;
        }
        uVar6 = toLocaltime(p,context);
LAB_001bd2c0:
        if (uVar6 != 0) {
          return 1;
        }
      }
      else if (bVar2 == 0x73) {
        iVar5 = sqlite3_strnicmp((char *)pbVar7,"start of ",9);
        if (iVar5 != 0) {
          return 1;
        }
        if (((p->validJD == '\0') && (p->validYMD == '\0')) && (p->validHMS == '\0')) {
          return 1;
        }
        pbVar7 = pbVar7 + 9;
        computeYMD(p);
        p->validHMS = '\x01';
        p->validTZ = '\0';
        p->h = 0;
        p->m = 0;
        p->s = 0.0;
        p->validJD = '\0';
        p->rawS = '\0';
        iVar5 = sqlite3StrICmp((char *)pbVar7,"month");
        if (iVar5 == 0) {
          p->D = 1;
        }
        else {
          iVar5 = sqlite3StrICmp((char *)pbVar7,"year");
          if (iVar5 != 0) {
            iVar5 = sqlite3StrICmp((char *)pbVar7,"day");
            uVar6 = (uint)(iVar5 != 0);
            goto LAB_001bd2c0;
          }
          p->M = 1;
          p->D = 1;
        }
      }
      else if (bVar2 == 0x75) {
        iVar5 = sqlite3StrICmp((char *)pbVar7,"unixepoch");
        if ((iVar5 == 0) && (p->rawS != '\0')) {
          if (1 < uVar12) {
            return 1;
          }
          dVar4 = p->s * 1000.0 + 210866760000000.0;
          if (dVar4 < 0.0) {
            return 1;
          }
          if (464269060800000.0 <= dVar4) {
            return 1;
          }
          goto LAB_001bd754;
        }
        iVar5 = sqlite3StrICmp((char *)pbVar7,"utc");
        if (iVar5 != 0) {
          return 1;
        }
        iVar5 = sqlite3NotPureFunc(context);
        if (iVar5 == 0) {
          return 1;
        }
        if (p->tzSet == '\0') {
          computeJD(p);
          lVar10 = p->iJD;
          lVar8 = 0;
          lVar11 = lVar10;
          uVar6 = 0;
          do {
            local_78.m = 0;
            local_78.tz = 0;
            local_78.s = 0.0;
            local_78.Y = 0;
            local_78.M = 0;
            local_78.D = 0;
            local_78.h = 0;
            lVar11 = lVar11 - (int)lVar8;
            local_78.validJD = '\x01';
            local_78.rawS = '\0';
            local_78.validYMD = '\0';
            local_78.validHMS = '\0';
            local_78.validTZ = '\0';
            local_78.tzSet = '\0';
            local_78.isError = '\0';
            local_78._47_1_ = 0;
            local_78.iJD = lVar11;
            iVar5 = toLocaltime(&local_78,context);
            if (iVar5 != 0) {
              return 1;
            }
            computeJD(&local_78);
            lVar8 = local_78.iJD - lVar10;
          } while (((int)lVar8 != 0) && (bVar14 = uVar6 < 3, uVar6 = uVar6 + 1, bVar14));
          *(undefined8 *)(local_48 + 4) = 0;
          *(double *)(local_48 + 6) = 0.0;
          *(undefined8 *)(local_48 + 8) = 0;
          local_48[0] = 0;
          local_48[1] = 0;
          *(undefined8 *)(local_48 + 2) = 0;
          p->iJD = lVar11;
          p->validJD = '\x01';
          p->tzSet = '\x01';
        }
      }
      else {
        if (bVar2 != 0x77) {
          return 1;
        }
        iVar5 = sqlite3_strnicmp((char *)pbVar7,"weekday ",8);
        if (iVar5 != 0) {
          return 1;
        }
        iVar5 = sqlite3Strlen30((char *)(pbVar7 + 8));
        iVar5 = sqlite3AtoF((char *)(pbVar7 + 8),(double *)&Y,iVar5,'\x01');
        if (iVar5 < 1) {
          return 1;
        }
        dVar4 = (double)CONCAT44(uStack_84,Y);
        if (dVar4 < 0.0) {
          return 1;
        }
        if (7.0 <= dVar4) {
          return 1;
        }
        if (dVar4 != (double)(int)dVar4) {
          return 1;
        }
        if (NAN(dVar4) || NAN((double)(int)dVar4)) {
          return 1;
        }
        computeYMD_HMS(p);
        p->validTZ = '\0';
        p->validJD = '\0';
        computeJD(p);
        lVar10 = ((p->iJD + 0x7b98a00) / 86400000) % 7;
        if ((int)dVar4 < lVar10) {
          lVar10 = lVar10 + -7;
        }
        p->iJD = ((int)dVar4 - lVar10) * 86400000 + p->iJD;
        p->validYMD = '\0';
        p->validHMS = '\0';
        p->validTZ = '\0';
      }
    }
LAB_001bd78a:
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

static int isDate(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv,
  DateTime *p
){
  int i, n;
  const unsigned char *z;
  int eType;
  memset(p, 0, sizeof(*p));
  if( argc==0 ){
    if( !sqlite3NotPureFunc(context) ) return 1;
    return setDateTimeToCurrent(context, p);
  }
  if( (eType = sqlite3_value_type(argv[0]))==SQLITE_FLOAT
                   || eType==SQLITE_INTEGER ){
    setRawDateNumber(p, sqlite3_value_double(argv[0]));
  }else{
    z = sqlite3_value_text(argv[0]);
    if( !z || parseDateOrTime(context, (char*)z, p) ){
      return 1;
    }
  }
  for(i=1; i<argc; i++){
    z = sqlite3_value_text(argv[i]);
    n = sqlite3_value_bytes(argv[i]);
    if( z==0 || parseModifier(context, (char*)z, n, p, i) ) return 1;
  }
  computeJD(p);
  if( p->isError || !validJulianDay(p->iJD) ) return 1;
  return 0;
}